

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O1

void __thiscall QGraphicsView::setTransform(QGraphicsView *this,QTransform *matrix,bool combine)

{
  QTransform *pQVar1;
  ushort uVar2;
  QGraphicsViewPrivate *this_00;
  Data *pDVar3;
  QRegionData *pQVar4;
  char cVar5;
  uint uVar6;
  long lVar7;
  undefined7 in_register_00000011;
  QTransform *pQVar8;
  qreal *pqVar9;
  qreal *pqVar10;
  QTransform *pQVar11;
  long in_FS_OFFSET;
  byte bVar12;
  QTransform oldMatrix;
  QTransform local_c0;
  QTransform local_70;
  long local_20;
  
  bVar12 = 0;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsViewPrivate **)(this + 8);
  pqVar9 = (qreal *)&DAT_00704bf8;
  pqVar10 = (qreal *)&local_70;
  for (lVar7 = 10; lVar7 != 0; lVar7 = lVar7 + -1) {
    *pqVar10 = *pqVar9;
    pqVar9 = pqVar9 + 1;
    pqVar10 = pqVar10 + 1;
  }
  pQVar1 = &this_00->matrix;
  pQVar8 = pQVar1;
  pqVar9 = (qreal *)&local_70;
  for (lVar7 = 10; lVar7 != 0; lVar7 = lVar7 + -1) {
    *pqVar9 = pQVar8->m_matrix[0][0];
    pQVar8 = (QTransform *)(pQVar8->m_matrix[0] + 1);
    pqVar9 = pqVar9 + 1;
  }
  if ((int)CONCAT71(in_register_00000011,combine) == 0) {
    pqVar9 = (qreal *)matrix;
    pQVar8 = pQVar1;
    for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
      pQVar8->m_matrix[0][0] = *pqVar9;
      pqVar9 = pqVar9 + 1;
      pQVar8 = (QTransform *)(pQVar8->m_matrix[0] + 1);
    }
    local_c0._72_2_ = *(undefined2 *)&matrix->field_0x48;
  }
  else {
    QTransform::operator*(&local_c0,matrix);
    pQVar8 = &local_c0;
    pQVar11 = pQVar1;
    for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
      pQVar11->m_matrix[0][0] = pQVar8->m_matrix[0][0];
      pQVar8 = (QTransform *)((long)pQVar8 + ((ulong)bVar12 * -2 + 1) * 8);
      pQVar11 = (QTransform *)((long)pQVar11 + (ulong)bVar12 * -0x10 + 8);
    }
  }
  *(undefined2 *)&(this_00->matrix).field_0x48 = local_c0._72_2_;
  cVar5 = QTransform::operator==(&local_70,pQVar1);
  if (cVar5 == '\0') {
    uVar2 = *(ushort *)&(this_00->matrix).field_0x48;
    if ((uVar2 & 0x3e0) == 0) {
      uVar6 = uVar2 & 0x1f;
    }
    else {
      uVar6 = QTransform::type();
    }
    *(uint *)&this_00->field_0x300 =
         (*(uint *)&this_00->field_0x300 & 0xfffffeef) + (uint)(uVar6 == 0) * 0x10 + 0x100;
    pDVar3 = (this_00->scene).wp.d;
    if (((pDVar3 == (Data *)0x0) || (*(int *)(pDVar3 + 4) == 0)) ||
       ((this_00->scene).wp.value == (QObject *)0x0)) {
      QGraphicsViewPrivate::updateLastCenterPoint(this_00);
    }
    else {
      QGraphicsViewPrivate::recalculateContentSize(this_00);
      QGraphicsViewPrivate::centerView(this_00,this_00->transformationAnchor);
    }
    if ((this_00->field_0x300 & 1) != 0) {
      QGraphicsViewPrivate::replayLastMouseEvent(this_00);
    }
    this_00->field_0x301 = this_00->field_0x301 & 0xfe;
    QWidget::update((this_00->super_QAbstractScrollAreaPrivate).viewport);
    this_00->field_0x301 = this_00->field_0x301 | 0x10;
    (this_00->dirtyBoundingRect).x1 = 0;
    (this_00->dirtyBoundingRect).y1 = 0;
    (this_00->dirtyBoundingRect).x2 = -1;
    (this_00->dirtyBoundingRect).y2 = -1;
    QRegion::QRegion((QRegion *)&local_c0);
    pQVar4 = (this_00->dirtyRegion).d;
    (this_00->dirtyRegion).d = (QRegionData *)local_c0.m_matrix[0][0];
    local_c0.m_matrix[0][0] = (qreal)pQVar4;
    QRegion::~QRegion((QRegion *)&local_c0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsView::setTransform(const QTransform &matrix, bool combine )
{
    Q_D(QGraphicsView);
    QTransform oldMatrix = d->matrix;
    if (!combine)
        d->matrix = matrix;
    else
        d->matrix = matrix * d->matrix;
    if (oldMatrix == d->matrix)
        return;

    d->identityMatrix = d->matrix.isIdentity();
    d->transforming = true;
    if (d->scene) {
        d->recalculateContentSize();
        d->centerView(d->transformationAnchor);
    } else {
        d->updateLastCenterPoint();
    }

    if (d->sceneInteractionAllowed)
        d->replayLastMouseEvent();
    d->transforming = false;

    // Any matrix operation requires a full update.
    d->updateAll();
}